

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.c
# Opt level: O2

int units_search(void *vkey,void *ventry)

{
  if (*vkey < *(ulong *)(*ventry + 0x18)) {
    return -1;
  }
  return (int)(*(ulong *)(*ventry + 0x20) <= *vkey);
}

Assistant:

static int
units_search (const void *vkey, const void *ventry)
{
  const size_t *key = (const size_t *) vkey;
  const struct unit *entry = *((const struct unit *const *) ventry);
  size_t offset;

  offset = *key;
  if (offset < entry->low_offset)
    return -1;
  else if (offset >= entry->high_offset)
    return 1;
  else
    return 0;
}